

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O1

bool opts::Converter<int>::convert(string *val,int *res)

{
  uint uVar1;
  istringstream iss;
  long local_190 [4];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)val,_S_in);
  std::istream::operator>>((istream *)local_190,res);
  uVar1 = *(uint *)((long)auStack_170 + *(long *)(local_190[0] + -0x18));
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return (uVar1 & 7) == 2;
}

Assistant:

static
    bool            convert(const std::string& val, T& res)
    {
        std::istringstream iss(val);
        iss >> res;
        return !iss.fail() && iss.eof();
    }